

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall
amrex::Geometry::GetFaceArea
          (Geometry *this,MultiFab *area,BoxArray *grds,DistributionMapping *dm,int dir,int ngrow)

{
  undefined8 in_RCX;
  long *in_RSI;
  undefined4 in_R9D;
  BoxArray edge_boxes;
  BoxArray *in_stack_fffffffffffffee8;
  BoxArray *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  int iVar1;
  BoxArray *in_stack_ffffffffffffff08;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  MultiFab *area_00;
  Geometry *this_00;
  undefined1 local_90 [104];
  undefined4 local_28;
  undefined8 local_20;
  long *local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_28 = in_R9D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  BoxArray::BoxArray(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  BoxArray::surroundingNodes(in_stack_ffffffffffffff08,iVar1);
  iVar1 = 0;
  area_00 = (MultiFab *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  this_00 = (Geometry *)0x0;
  MFInfo::MFInfo((MFInfo *)0x10330fb);
  local_d0 = 0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffef0);
  (**(code **)(*local_10 + 0x10))(local_10,local_90,local_20,1,local_28,&local_c8,&local_d0);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1033154);
  MFInfo::~MFInfo((MFInfo *)0x103315e);
  GetFaceArea(this_00,area_00,iVar1);
  BoxArray::~BoxArray(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void
Geometry::GetFaceArea (MultiFab&       area,
                       const BoxArray& grds,
                       const DistributionMapping& dm,
                       int             dir,
                       int             ngrow) const
{
    BoxArray edge_boxes(grds);
    edge_boxes.surroundingNodes(dir);
    area.define(edge_boxes,dm,1,ngrow,MFInfo(),FArrayBoxFactory());

    GetFaceArea(area, dir);
}